

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_hdr_set(bcf_hdr_t *hdr,char *fname)

{
  int iVar1;
  undefined8 in_RAX;
  char **__ptr;
  bcf_hrec_t *hrec;
  ulong uVar2;
  long lVar3;
  int n;
  int k;
  undefined8 local_28;
  
  local_28 = in_RAX;
  __ptr = hts_readlines(fname,(int *)&local_28);
  if (__ptr == (char **)0x0) {
    iVar1 = 1;
  }
  else {
    if ((int)local_28 < 2) {
      uVar2 = (ulong)((int)local_28 - 1);
    }
    else {
      lVar3 = 0;
      do {
        hrec = bcf_hdr_parse_line((bcf_hdr_t *)fname,__ptr[lVar3],(int *)((long)&local_28 + 4));
        if (hrec != (bcf_hrec_t *)0x0) {
          bcf_hdr_add_hrec(hdr,hrec);
        }
        fname = __ptr[lVar3];
        free(fname);
        lVar3 = lVar3 + 1;
        uVar2 = (long)(int)local_28 - 1;
      } while (lVar3 < (long)uVar2);
    }
    bcf_hdr_parse_sample_line(hdr,__ptr[(int)uVar2]);
    free(__ptr[(long)(int)local_28 + -1]);
    free(__ptr);
    bcf_hdr_sync(hdr);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int bcf_hdr_set(bcf_hdr_t *hdr, const char *fname)
{
    int i, n;
    char **lines = hts_readlines(fname, &n);
    if ( !lines ) return 1;
    for (i=0; i<n-1; i++)
    {
        int k;
        bcf_hrec_t *hrec = bcf_hdr_parse_line(hdr,lines[i],&k);
        if ( hrec ) bcf_hdr_add_hrec(hdr, hrec);
        free(lines[i]);
    }
    bcf_hdr_parse_sample_line(hdr,lines[n-1]);
    free(lines[n-1]);
    free(lines);
    bcf_hdr_sync(hdr);
    return 0;
}